

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall slang::parsing::Parser::Parser(Parser *this,Preprocessor *preprocessor,Bag *options)

{
  ParserOptions PVar1;
  Diagnostics *diagnostics;
  
  ParserBase::ParserBase(&this->super_ParserBase,preprocessor);
  (this->factory).alloc = (this->super_ParserBase).alloc;
  this->previewNode = (SyntaxNode *)0x0;
  PVar1 = Bag::getOrDefault<slang::parsing::ParserOptions>(options);
  this->parseOptions = PVar1;
  ParserMetadata::ParserMetadata(&this->meta);
  diagnostics = ParserBase::getDiagnostics(&this->super_ParserBase);
  NumberParser::NumberParser
            (&this->numberParser,diagnostics,(this->super_ParserBase).alloc,
             (this->parseOptions).languageVersion);
  (this->moduleDeclStack).
  super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .data_ = (pointer)(this->moduleDeclStack).
                    super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                    .firstElement;
  (this->moduleDeclStack).
  super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .len = 0;
  (this->moduleDeclStack).
  super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .cap = 4;
  this->recursionDepth = 0;
  this->currentDefinitionKind = Unknown;
  return;
}

Assistant:

Parser::Parser(Preprocessor& preprocessor, const Bag& options) :
    ParserBase::ParserBase(preprocessor), factory(alloc),
    parseOptions(options.getOrDefault<ParserOptions>()),
    numberParser(getDiagnostics(), alloc, parseOptions.languageVersion) {
}